

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O3

void __thiscall
delaunator::Delaunator::Delaunator
          (Delaunator *this,vector<double,_std::allocator<double>_> *in_coords)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_03;
  double dVar1;
  size_t i1;
  size_t i0;
  long lVar2;
  _Iter_comp_iter<delaunator::compare> __comp;
  _Iter_comp_iter<delaunator::compare> __comp_00;
  undefined1 __first [8];
  ulong uVar3;
  size_type sVar4;
  unsigned_long uVar5;
  size_t sVar6;
  size_t sVar7;
  pointer puVar8;
  runtime_error *this_04;
  pointer puVar9;
  double *pdVar10;
  vector<double,_std::allocator<double>_> *pvVar11;
  ulong uVar12;
  vector<double,_std::allocator<double>_> *__n;
  pointer puVar13;
  vector<double,_std::allocator<double>_> *pvVar14;
  ulong uVar15;
  pointer pdVar16;
  vector<double,_std::allocator<double>_> *i0_00;
  size_t i0_01;
  ulong uVar17;
  vector<double,_std::allocator<double>_> *pvVar18;
  vector<double,_std::allocator<double>_> *pvVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dx;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  vector<double,_std::allocator<double>_> *local_e8;
  double dStack_e0;
  double local_d8;
  double local_c8;
  double local_c0;
  undefined1 auStack_b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> ids;
  double local_88;
  double local_70;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  
  this->coords = in_coords;
  this_00 = &this->hull_prev;
  this_01 = &this->hull_next;
  this_02 = &this->hull_tri;
  this_03 = &this->m_hash;
  memset(&this->triangles,0,200);
  uVar17 = (long)(in_coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in_coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  __n = (vector<double,_std::allocator<double>_> *)(uVar17 >> 1);
  auStack_b8 = (undefined1  [8])0x0;
  ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_b8,(size_type)__n);
  local_e8 = (vector<double,_std::allocator<double>_> *)0x0;
  pvVar18 = local_e8;
  if (1 < uVar17) {
    local_50 = 2.2250738585072014e-308;
    local_48 = 2.2250738585072014e-308;
    local_40 = 1.79769313486232e+308;
    local_58 = 1.79769313486232e+308;
    do {
      pdVar16 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      dVar1 = pdVar16[(long)local_e8 * 2];
      dVar24 = pdVar16[(long)local_e8 * 2 + 1];
      if (ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_b8,
                   (iterator)
                   ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,(unsigned_long *)&local_e8);
      }
      else {
        *ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = (unsigned_long)local_e8;
        ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      puVar9 = ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      __first = auStack_b8;
      uVar22 = SUB84(dVar1,0);
      uVar23 = (undefined4)((ulong)dVar1 >> 0x20);
      if (local_40 <= dVar1) {
        uVar22 = SUB84(local_40,0);
        uVar23 = (undefined4)((ulong)local_40 >> 0x20);
      }
      uVar20 = SUB84(dVar24,0);
      uVar21 = (undefined4)((ulong)dVar24 >> 0x20);
      dVar26 = dVar24;
      if (local_58 <= dVar24) {
        dVar26 = local_58;
      }
      if (dVar1 <= local_50) {
        dVar1 = local_50;
      }
      if (dVar24 <= local_48) {
        uVar20 = SUB84(local_48,0);
        uVar21 = (undefined4)((ulong)local_48 >> 0x20);
      }
      pvVar18 = (vector<double,_std::allocator<double>_> *)
                ((long)&(local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
      local_48 = (double)CONCAT44(uVar21,uVar20);
      local_40 = (double)CONCAT44(uVar23,uVar22);
      local_e8 = pvVar18;
      local_58 = dVar26;
      local_50 = dVar1;
    } while (pvVar18 < __n);
    if (1 < uVar17) {
      local_e8 = this->coords;
      pdVar16 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar10 = pdVar16 + 1;
      i0_00 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
      pvVar11 = (vector<double,_std::allocator<double>_> *)0x0;
      dVar24 = 1.79769313486232e+308;
      do {
        dVar25 = ((double)CONCAT44(uVar23,uVar22) + dVar1) * 0.5 - pdVar10[-1];
        dVar27 = (dVar26 + (double)CONCAT44(uVar21,uVar20)) * 0.5 - *pdVar10;
        dVar25 = dVar25 * dVar25 + dVar27 * dVar27;
        pvVar19 = pvVar11;
        if (dVar24 <= dVar25) {
          dVar25 = dVar24;
          pvVar19 = i0_00;
        }
        i0_00 = pvVar19;
        pvVar11 = (vector<double,_std::allocator<double>_> *)
                  ((long)&(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start + 1);
        pdVar10 = pdVar10 + 2;
        dVar24 = dVar25;
      } while (__n != pvVar11);
      if (1 < uVar17) {
        dVar24 = pdVar16[(long)i0_00 * 2];
        dVar1 = pdVar16[(long)i0_00 * 2 + 1];
        pdVar10 = pdVar16 + 1;
        pvVar11 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
        dVar26 = 1.79769313486232e+308;
        pvVar19 = (vector<double,_std::allocator<double>_> *)0x0;
        do {
          if (((i0_00 != pvVar19) &&
              (dVar25 = (dVar24 - pdVar10[-1]) * (dVar24 - pdVar10[-1]) +
                        (dVar1 - *pdVar10) * (dVar1 - *pdVar10), dVar25 < dVar26)) && (0.0 < dVar25)
             ) {
            pvVar11 = pvVar19;
            dVar26 = dVar25;
          }
          pvVar19 = (vector<double,_std::allocator<double>_> *)
                    ((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start + 1);
          pdVar10 = pdVar10 + 2;
        } while (__n != pvVar19);
        if (1 < uVar17) {
          local_70 = pdVar16[(long)pvVar11 * 2];
          local_88 = pdVar16[(long)pvVar11 * 2 + 1];
          dVar27 = local_70 - dVar24;
          dVar26 = local_88 - dVar1;
          dVar28 = dVar27 * dVar27 + dVar26 * dVar26;
          pdVar10 = pdVar16 + 1;
          pvVar19 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
          pvVar14 = (vector<double,_std::allocator<double>_> *)0x0;
          dVar25 = 1.79769313486232e+308;
          do {
            if (pvVar11 != pvVar14 && i0_00 != pvVar14) {
              dVar31 = pdVar10[-1] - dVar24;
              dVar29 = *pdVar10 - dVar1;
              dVar33 = dVar27 * dVar29 + dVar31 * -dVar26;
              dVar30 = 1.79769313486232e+308;
              if (dVar33 != 0.0) {
                dVar32 = dVar31 * dVar31 + dVar29 * dVar29;
                dVar30 = ((dVar29 * dVar28 + dVar32 * -dVar26) * 0.5) / dVar33;
                dVar33 = ((dVar27 * dVar32 - dVar28 * dVar31) * 0.5) / dVar33;
                dVar30 = (double)(-(ulong)(dVar28 <= 0.0) & 0x7fefffffffffffff |
                                 ~-(ulong)(dVar28 <= 0.0) &
                                 (-(ulong)(dVar32 <= 0.0) & 0x7fefffffffffffff |
                                 ~-(ulong)(dVar32 <= 0.0) &
                                 (ulong)(dVar30 * dVar30 + dVar33 * dVar33)));
              }
              if (dVar30 < dVar25) {
                pvVar19 = pvVar14;
                dVar25 = dVar30;
              }
            }
            pvVar14 = (vector<double,_std::allocator<double>_> *)
                      ((long)&(pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                              .super__Vector_impl_data._M_start + 1);
            pdVar10 = pdVar10 + 2;
          } while (__n != pvVar14);
          if (dVar25 < 1.79769313486232e+308) {
            dVar25 = pdVar16[(long)pvVar19 * 2];
            dVar28 = pdVar16[(long)pvVar19 * 2 + 1];
            dVar31 = dVar25 - dVar24;
            pvVar18 = pvVar19;
            dVar30 = dVar27;
            dVar29 = dVar28 - dVar1;
            local_c8 = dVar25;
            local_c0 = dVar28;
            if ((dVar25 - local_70) * dVar26 - (dVar28 - local_88) * dVar27 < 0.0) {
              pvVar18 = pvVar11;
              pvVar11 = pvVar19;
              dVar30 = dVar31;
              dVar29 = dVar26;
              dVar26 = dVar28 - dVar1;
              dVar31 = dVar27;
              local_c8 = local_70;
              local_c0 = local_88;
              local_88 = dVar28;
              local_70 = dVar25;
            }
            dVar27 = dVar30 * dVar30 + dVar26 * dVar26;
            dVar25 = dVar31 * dVar31 + dVar29 * dVar29;
            dVar28 = dVar30 * dVar29 - dVar31 * dVar26;
            dStack_e0 = ((dVar29 * dVar27 - dVar26 * dVar25) * 0.5) / dVar28 + dVar24;
            local_d8 = ((dVar25 * dVar30 + dVar27 * -dVar31) * 0.5) / dVar28 + dVar1;
            this->m_center_x = dStack_e0;
            this->m_center_y = local_d8;
            if (auStack_b8 !=
                (undefined1  [8])
                ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar3 = (long)ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start - (long)auStack_b8 >> 3;
              lVar2 = 0x3f;
              if (uVar3 != 0) {
                for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
                }
              }
              __comp._M_comp.cx = dStack_e0;
              __comp._M_comp.coords = local_e8;
              __comp._M_comp.cy = local_d8;
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<delaunator::compare>>
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )auStack_b8,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                         (ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp);
              __comp_00._M_comp.cx = dStack_e0;
              __comp_00._M_comp.coords = local_e8;
              __comp_00._M_comp.cy = local_d8;
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<delaunator::compare>>
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )__first,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )puVar9,__comp_00);
            }
            dVar26 = ceil(SQRT((double)(long)__n));
            sVar4 = llround(dVar26);
            this->m_hash_size = sVar4;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_03,sVar4);
            puVar9 = (this->m_hash).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar8 = (this->m_hash).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (puVar9 != puVar8) {
              memset(puVar9,0xff,((long)puVar8 + (-8 - (long)puVar9) & 0xfffffffffffffff8U) + 8);
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                      (this_00,(size_type)__n);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                      (this_01,(size_type)__n);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                      (this_02,(size_type)__n);
            this->hull_start = (size_t)i0_00;
            puVar9 = (this->hull_prev).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar9[(long)pvVar18] = (unsigned_long)pvVar11;
            puVar8 = (this->hull_next).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar8[(long)i0_00] = (unsigned_long)pvVar11;
            puVar9[(long)i0_00] = (unsigned_long)pvVar18;
            puVar8[(long)pvVar11] = (unsigned_long)pvVar18;
            puVar9[(long)pvVar11] = (unsigned_long)i0_00;
            puVar8[(long)pvVar18] = (unsigned_long)i0_00;
            puVar9 = (this->hull_tri).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar9[(long)i0_00] = 0;
            puVar9[(long)pvVar11] = 1;
            puVar9[(long)pvVar18] = 2;
            dVar26 = dVar24 - this->m_center_x;
            dVar25 = dVar1 - this->m_center_y;
            dVar26 = dVar26 / (ABS(dVar25) + ABS(dVar26));
            uVar3 = -(ulong)(0.0 < dVar25);
            dVar26 = floor((((double)CONCAT44(0x45300000,(int)(this->m_hash_size >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)this->m_hash_size) - 4503599627370496.0
                           )) * (double)(~uVar3 & (ulong)(dVar26 + 1.0) |
                                        (ulong)(3.0 - dVar26) & uVar3) * 0.25);
            uVar3 = llround(dVar26);
            if (this->m_hash_size <= uVar3) {
              uVar3 = uVar3 % this->m_hash_size;
            }
            (this->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start[uVar3] = (unsigned_long)i0_00;
            dVar26 = local_70 - this->m_center_x;
            dVar25 = local_88 - this->m_center_y;
            uVar3 = -(ulong)(0.0 < dVar25);
            dVar26 = dVar26 / (ABS(dVar25) + ABS(dVar26));
            dVar26 = floor((((double)CONCAT44(0x45300000,(int)(this->m_hash_size >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)this->m_hash_size) - 4503599627370496.0
                           )) * (double)(~uVar3 & (ulong)(dVar26 + 1.0) |
                                        (ulong)(3.0 - dVar26) & uVar3) * 0.25);
            uVar3 = llround(dVar26);
            if (this->m_hash_size <= uVar3) {
              uVar3 = uVar3 % this->m_hash_size;
            }
            (this->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start[uVar3] = (unsigned_long)pvVar11;
            dVar26 = local_c8 - this->m_center_x;
            dVar25 = local_c0 - this->m_center_y;
            uVar3 = -(ulong)(0.0 < dVar25);
            dVar26 = dVar26 / (ABS(dVar25) + ABS(dVar26));
            dVar26 = floor((((double)CONCAT44(0x45300000,(int)(this->m_hash_size >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)this->m_hash_size) - 4503599627370496.0
                           )) * (double)(~uVar3 & (ulong)(dVar26 + 1.0) |
                                        (ulong)(3.0 - dVar26) & uVar3) * 0.25);
            uVar3 = llround(dVar26);
            if (this->m_hash_size <= uVar3) {
              uVar3 = uVar3 % this->m_hash_size;
            }
            (this_03->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar3] = (unsigned_long)pvVar18;
            sVar4 = 3;
            if (5 < uVar17) {
              sVar4 = (uVar17 & 0xfffffffffffffffe) * 3 - 0xf;
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                      (&this->triangles,sVar4);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                      (&this->halfedges,sVar4);
            add_triangle(this,(size_t)i0_00,(size_t)pvVar11,(size_t)pvVar18,0xffffffffffffffff,
                         0xffffffffffffffff,0xffffffffffffffff);
            if (1 < uVar17) {
              uVar20 = 0;
              uVar21 = 0x7ff80000;
              pvVar18 = (vector<double,_std::allocator<double>_> *)0x0;
              uVar22 = uVar20;
              uVar23 = uVar21;
              do {
                i1 = *(size_t *)((long)auStack_b8 + pvVar18 * 8);
                pdVar16 = (this->coords->super__Vector_base<double,_std::allocator<double>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                dVar26 = pdVar16[i1 * 2];
                dVar25 = pdVar16[i1 * 2 + 1];
                if (((pvVar18 == (vector<double,_std::allocator<double>_> *)0x0) ||
                    (2.220446049250313e-16 < ABS(dVar26 - (double)CONCAT44(uVar23,uVar22)))) ||
                   (2.220446049250313e-16 < ABS(dVar25 - (double)CONCAT44(uVar21,uVar20)))) {
                  uVar20 = SUB84(dVar25,0);
                  uVar21 = (undefined4)((ulong)dVar25 >> 0x20);
                  uVar22 = SUB84(dVar26,0);
                  uVar23 = (undefined4)((ulong)dVar26 >> 0x20);
                  if (((2.220446049250313e-16 < ABS(dVar26 - dVar24)) ||
                      (2.220446049250313e-16 < ABS(dVar25 - dVar1))) &&
                     (((2.220446049250313e-16 < ABS(dVar26 - local_70) ||
                       (2.220446049250313e-16 < ABS(dVar25 - local_88))) &&
                      ((2.220446049250313e-16 < ABS(dVar26 - local_c8) ||
                       (2.220446049250313e-16 < ABS(dVar25 - local_c0))))))) {
                    dVar27 = dVar26 - this->m_center_x;
                    dVar28 = dVar25 - this->m_center_y;
                    uVar17 = -(ulong)(0.0 < dVar28);
                    dVar27 = dVar27 / (ABS(dVar28) + ABS(dVar27));
                    dVar27 = floor((((double)CONCAT44(0x45300000,(int)(this->m_hash_size >> 0x20)) -
                                    1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)this->m_hash_size) -
                                   4503599627370496.0)) *
                                   (double)(~uVar17 & (ulong)(dVar27 + 1.0) |
                                           (ulong)(3.0 - dVar27) & uVar17) * 0.25);
                    uVar3 = llround(dVar27);
                    uVar17 = this->m_hash_size;
                    if (uVar17 <= uVar3) {
                      uVar3 = uVar3 % uVar17;
                    }
                    puVar9 = (this_01->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    uVar15 = 0;
                    do {
                      while( true ) {
                        uVar12 = uVar15 + uVar3;
                        if (uVar17 <= uVar12) {
                          uVar12 = uVar12 % uVar17;
                        }
                        uVar5 = (this_03->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start[uVar12];
                        if (uVar5 == 0xffffffffffffffff) break;
                        if ((uVar5 != puVar9[uVar5]) || (uVar15 = uVar15 + 1, uVar17 <= uVar15))
                        goto LAB_00109510;
                      }
                      uVar15 = uVar15 + 1;
                    } while (uVar15 < uVar17);
                    uVar5 = 0xffffffffffffffff;
LAB_00109510:
                    i0 = (this->hull_prev).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar5];
                    pdVar16 = (this->coords->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    i0_01 = i0;
                    do {
                      sVar6 = puVar9[i0_01];
                      if ((pdVar16[sVar6 * 2] - pdVar16[i0_01 * 2]) *
                          (pdVar16[i0_01 * 2 + 1] - dVar25) -
                          (pdVar16[sVar6 * 2 + 1] - pdVar16[i0_01 * 2 + 1]) *
                          (pdVar16[i0_01 * 2] - dVar26) < 0.0) {
                        if (i0_01 != 0xffffffffffffffff) {
                          sVar6 = add_triangle(this,i0_01,i1,sVar6,0xffffffffffffffff,
                                               0xffffffffffffffff,
                                               (this->hull_tri).
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start[i0_01]);
                          sVar7 = legalize(this,sVar6 + 2);
                          puVar9 = (this_02->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                          puVar9[i1] = sVar7;
                          puVar9[i0_01] = sVar6;
                          puVar8 = (this_01->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                          uVar5 = puVar8[i0_01];
                          while( true ) {
                            sVar6 = puVar8[uVar5];
                            pdVar16 = (this->coords->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data._M_start;
                            if (0.0 <= (pdVar16[sVar6 * 2] - pdVar16[uVar5 * 2]) *
                                       (pdVar16[uVar5 * 2 + 1] - dVar25) -
                                       (pdVar16[sVar6 * 2 + 1] - pdVar16[uVar5 * 2 + 1]) *
                                       (pdVar16[uVar5 * 2] - dVar26)) break;
                            sVar7 = add_triangle(this,uVar5,i1,sVar6,puVar9[i1],0xffffffffffffffff,
                                                 puVar9[uVar5]);
                            sVar7 = legalize(this,sVar7 + 2);
                            puVar9 = (this_02->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start;
                            puVar9[i1] = sVar7;
                            puVar8 = (this_01->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start;
                            puVar8[uVar5] = uVar5;
                            uVar5 = sVar6;
                          }
                          if (i0_01 == i0) {
                            while( true ) {
                              i0_01 = i0;
                              puVar13 = (this_00->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start;
                              i0 = puVar13[i0_01];
                              if (0.0 <= (pdVar16[i0_01 * 2] - pdVar16[i0 * 2]) *
                                         (pdVar16[i0 * 2 + 1] - dVar25) -
                                         (pdVar16[i0_01 * 2 + 1] - pdVar16[i0 * 2 + 1]) *
                                         (pdVar16[i0 * 2] - dVar26)) break;
                              sVar6 = add_triangle(this,i0,i1,i0_01,0xffffffffffffffff,puVar9[i0_01]
                                                   ,puVar9[i0]);
                              legalize(this,sVar6 + 2);
                              puVar9 = (this->hull_tri).
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              puVar9[i0] = sVar6;
                              puVar8 = (this->hull_next).
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              puVar8[i0_01] = i0_01;
                              pdVar16 = (this->coords->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_start;
                            }
                          }
                          else {
                            puVar13 = (this_00->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start;
                          }
                          puVar13[i1] = i0_01;
                          this->hull_start = i0_01;
                          puVar13[uVar5] = i1;
                          puVar8[i0_01] = i1;
                          puVar8[i1] = uVar5;
                          dVar26 = dVar26 - this->m_center_x;
                          dVar25 = dVar25 - this->m_center_y;
                          uVar17 = -(ulong)(0.0 < dVar25);
                          dVar26 = dVar26 / (ABS(dVar25) + ABS(dVar26));
                          dVar26 = floor((((double)CONCAT44(0x45300000,
                                                            (int)(this->m_hash_size >> 0x20)) -
                                          1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,(int)this->m_hash_size) -
                                         4503599627370496.0)) *
                                         (double)(~uVar17 & (ulong)(dVar26 + 1.0) |
                                                 (ulong)(3.0 - dVar26) & uVar17) * 0.25);
                          uVar17 = llround(dVar26);
                          if (this->m_hash_size <= uVar17) {
                            uVar17 = uVar17 % this->m_hash_size;
                          }
                          (this->m_hash).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar17] = i1;
                          pdVar16 = (this->coords->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_start;
                          dVar26 = pdVar16[i0_01 * 2] - this->m_center_x;
                          dVar25 = pdVar16[i0_01 * 2 + 1] - this->m_center_y;
                          uVar17 = -(ulong)(0.0 < dVar25);
                          dVar26 = dVar26 / (ABS(dVar25) + ABS(dVar26));
                          dVar26 = floor((((double)CONCAT44(0x45300000,
                                                            (int)(this->m_hash_size >> 0x20)) -
                                          1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,(int)this->m_hash_size) -
                                         4503599627370496.0)) *
                                         (double)(~uVar17 & (ulong)(dVar26 + 1.0) |
                                                 (ulong)(3.0 - dVar26) & uVar17) * 0.25);
                          uVar17 = llround(dVar26);
                          if (this->m_hash_size <= uVar17) {
                            uVar17 = uVar17 % this->m_hash_size;
                          }
                          (this_03->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar17] = i0_01;
                        }
                        break;
                      }
                      i0_01 = sVar6;
                    } while (sVar6 != i0);
                  }
                }
                pvVar18 = (vector<double,_std::allocator<double>_> *)
                          ((long)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start + 1);
              } while (pvVar18 != __n);
            }
            if (auStack_b8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_b8,
                              (long)ids.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_b8);
            }
            return;
          }
        }
      }
    }
  }
  local_e8 = pvVar18;
  this_04 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_04,"not triangulation");
  __cxa_throw(this_04,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Delaunator::Delaunator(std::vector<double> const& in_coords)
    : coords(in_coords),
      triangles(),
      halfedges(),
      hull_prev(),
      hull_next(),
      hull_tri(),
      hull_start(),
      m_hash(),
      m_center_x(),
      m_center_y(),
      m_hash_size(),
      m_edge_stack() {
    std::size_t n = coords.size() >> 1;

    double max_x = std::numeric_limits<double>::min();
    double max_y = std::numeric_limits<double>::min();
    double min_x = std::numeric_limits<double>::max();
    double min_y = std::numeric_limits<double>::max();
    std::vector<std::size_t> ids;
    ids.reserve(n);

    for (std::size_t i = 0; i < n; i++) {
        const double x = coords[2 * i];
        const double y = coords[2 * i + 1];

        if (x < min_x) min_x = x;
        if (y < min_y) min_y = y;
        if (x > max_x) max_x = x;
        if (y > max_y) max_y = y;

        ids.push_back(i);
    }
    const double cx = (min_x + max_x) / 2;
    const double cy = (min_y + max_y) / 2;
    double min_dist = std::numeric_limits<double>::max();

    std::size_t i0 = INVALID_INDEX;
    std::size_t i1 = INVALID_INDEX;
    std::size_t i2 = INVALID_INDEX;

    // pick a seed point close to the centroid
    for (std::size_t i = 0; i < n; i++) {
        const double d = dist(cx, cy, coords[2 * i], coords[2 * i + 1]);
        if (d < min_dist) {
            i0 = i;
            min_dist = d;
        }
    }

    const double i0x = coords[2 * i0];
    const double i0y = coords[2 * i0 + 1];

    min_dist = std::numeric_limits<double>::max();

    // find the point closest to the seed
    for (std::size_t i = 0; i < n; i++) {
        if (i == i0) continue;
        const double d = dist(i0x, i0y, coords[2 * i], coords[2 * i + 1]);
        if (d < min_dist && d > 0.0) {
            i1 = i;
            min_dist = d;
        }
    }

    double i1x = coords[2 * i1];
    double i1y = coords[2 * i1 + 1];

    double min_radius = std::numeric_limits<double>::max();

    // find the third point which forms the smallest circumcircle with the first two
    for (std::size_t i = 0; i < n; i++) {
        if (i == i0 || i == i1) continue;

        const double r = circumradius(
            i0x, i0y, i1x, i1y, coords[2 * i], coords[2 * i + 1]);

        if (r < min_radius) {
            i2 = i;
            min_radius = r;
        }
    }

    if (!(min_radius < std::numeric_limits<double>::max())) {
        throw std::runtime_error("not triangulation");
    }

    double i2x = coords[2 * i2];
    double i2y = coords[2 * i2 + 1];

    if (orient(i0x, i0y, i1x, i1y, i2x, i2y)) {
        std::swap(i1, i2);
        std::swap(i1x, i2x);
        std::swap(i1y, i2y);
    }

    std::tie(m_center_x, m_center_y) = circumcenter(i0x, i0y, i1x, i1y, i2x, i2y);

    // sort the points by distance from the seed triangle circumcenter
    std::sort(ids.begin(), ids.end(), compare{ coords, m_center_x, m_center_y });

    // initialize a hash table for storing edges of the advancing convex hull
    m_hash_size = static_cast<std::size_t>(std::llround(std::ceil(std::sqrt(n))));
    m_hash.resize(m_hash_size);
    std::fill(m_hash.begin(), m_hash.end(), INVALID_INDEX);

    // initialize arrays for tracking the edges of the advancing convex hull
    hull_prev.resize(n);
    hull_next.resize(n);
    hull_tri.resize(n);

    hull_start = i0;

    size_t hull_size = 3;

    hull_next[i0] = hull_prev[i2] = i1;
    hull_next[i1] = hull_prev[i0] = i2;
    hull_next[i2] = hull_prev[i1] = i0;

    hull_tri[i0] = 0;
    hull_tri[i1] = 1;
    hull_tri[i2] = 2;

    m_hash[hash_key(i0x, i0y)] = i0;
    m_hash[hash_key(i1x, i1y)] = i1;
    m_hash[hash_key(i2x, i2y)] = i2;

    std::size_t max_triangles = n < 3 ? 1 : 2 * n - 5;
    triangles.reserve(max_triangles * 3);
    halfedges.reserve(max_triangles * 3);
    add_triangle(i0, i1, i2, INVALID_INDEX, INVALID_INDEX, INVALID_INDEX);
    double xp = std::numeric_limits<double>::quiet_NaN();
    double yp = std::numeric_limits<double>::quiet_NaN();
    for (std::size_t k = 0; k < n; k++) {
        const std::size_t i = ids[k];
        const double x = coords[2 * i];
        const double y = coords[2 * i + 1];

        // skip near-duplicate points
        if (k > 0 && check_pts_equal(x, y, xp, yp)) continue;
        xp = x;
        yp = y;

        // skip seed triangle points
        if (
            check_pts_equal(x, y, i0x, i0y) ||
            check_pts_equal(x, y, i1x, i1y) ||
            check_pts_equal(x, y, i2x, i2y)) continue;

        // find a visible edge on the convex hull using edge hash
        std::size_t start = 0;

        size_t key = hash_key(x, y);
        for (size_t j = 0; j < m_hash_size; j++) {
            start = m_hash[fast_mod(key + j, m_hash_size)];
            if (start != INVALID_INDEX && start != hull_next[start]) break;
        }

        start = hull_prev[start];
        size_t e = start;
        size_t q;

        while (q = hull_next[e], !orient(x, y, coords[2 * e], coords[2 * e + 1], coords[2 * q], coords[2 * q + 1])) { //TODO: does it works in a same way as in JS
            e = q;
            if (e == start) {
                e = INVALID_INDEX;
                break;
            }
        }

        if (e == INVALID_INDEX) continue; // likely a near-duplicate point; skip it

        // add the first triangle from the point
        std::size_t t = add_triangle(
            e,
            i,
            hull_next[e],
            INVALID_INDEX,
            INVALID_INDEX,
            hull_tri[e]);

        hull_tri[i] = legalize(t + 2);
        hull_tri[e] = t;
        hull_size++;

        // walk forward through the hull, adding more triangles and flipping recursively
        std::size_t next = hull_next[e];
        while (
            q = hull_next[next],
            orient(x, y, coords[2 * next], coords[2 * next + 1], coords[2 * q], coords[2 * q + 1])) {
            t = add_triangle(next, i, q, hull_tri[i], INVALID_INDEX, hull_tri[next]);
            hull_tri[i] = legalize(t + 2);
            hull_next[next] = next; // mark as removed
            hull_size--;
            next = q;
        }

        // walk backward from the other side, adding more triangles and flipping
        if (e == start) {
            while (
                q = hull_prev[e],
                orient(x, y, coords[2 * q], coords[2 * q + 1], coords[2 * e], coords[2 * e + 1])) {
                t = add_triangle(q, i, e, INVALID_INDEX, hull_tri[e], hull_tri[q]);
                legalize(t + 2);
                hull_tri[q] = t;
                hull_next[e] = e; // mark as removed
                hull_size--;
                e = q;
            }
        }

        // update the hull indices
        hull_prev[i] = e;
        hull_start = e;
        hull_prev[next] = i;
        hull_next[e] = i;
        hull_next[i] = next;

        m_hash[hash_key(x, y)] = i;
        m_hash[hash_key(coords[2 * e], coords[2 * e + 1])] = e;
    }
}